

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceDataEntry * entryOpen(char *path,char *localeID,UResOpenType openType,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *__src;
  bool bVar3;
  UResourceDataEntry *u1;
  char local_158 [4];
  UErrorCode usrStatus;
  char usrDataPath [96];
  char name [157];
  UBool local_4c;
  char local_4b;
  UBool local_4a;
  UBool local_49;
  UBool usingUSRData;
  UBool hasChopped;
  UBool hasRealData;
  UBool isRoot;
  UResourceDataEntry *pUStack_48;
  UBool isDefault;
  UResourceDataEntry *t1;
  UResourceDataEntry *r;
  UErrorCode *pUStack_30;
  UErrorCode intStatus;
  UErrorCode *status_local;
  char *pcStack_20;
  UResOpenType openType_local;
  char *localeID_local;
  char *path_local;
  
  r._4_4_ = U_ZERO_ERROR;
  t1 = (UResourceDataEntry *)0x0;
  pUStack_48 = (UResourceDataEntry *)0x0;
  local_49 = '\0';
  local_4a = '\0';
  local_4b = '\0';
  local_4c = '\x01';
  pUStack_30 = status;
  status_local._4_4_ = openType;
  pcStack_20 = localeID;
  localeID_local = path;
  initCache(status);
  UVar1 = U_FAILURE(*pUStack_30);
  if (UVar1 != '\0') {
    return (UResourceDataEntry *)0x0;
  }
  strncpy(usrDataPath + 0x58,pcStack_20,0x9c);
  umtx_lock_63(&resbMutex);
  t1 = findFirstExisting(localeID_local,usrDataPath + 0x58,&local_4a,&local_4c,&local_49,
                         (UErrorCode *)((long)&r + 4));
  if (r._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
    *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
  }
  else if ((((t1 == (UResourceDataEntry *)0x0) ||
            (local_4b = '\x01', pUStack_48 = t1, local_4c == '\0')) || (local_4a != '\0')) ||
          (UVar1 = loadParentsExceptRoot
                             (&stack0xffffffffffffffb8,usrDataPath + 0x58,0x9d,'\0',local_158,
                              pUStack_30), UVar1 != '\0')) {
    if (((t1 == (UResourceDataEntry *)0x0) && (status_local._4_4_ == URES_OPEN_LOCALE_DEFAULT_ROOT))
       && ((local_49 == '\0' && (local_4a == '\0')))) {
      __src = uloc_getDefault_63();
      strcpy(usrDataPath + 0x58,__src);
      t1 = findFirstExisting(localeID_local,usrDataPath + 0x58,&local_4a,&local_4c,&local_49,
                             (UErrorCode *)((long)&r + 4));
      if (r._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
        *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_0039a74a;
      }
      r._4_4_ = U_USING_DEFAULT_WARNING;
      if (t1 != (UResourceDataEntry *)0x0) {
        local_4b = '\x01';
        local_49 = '\x01';
        pUStack_48 = t1;
        if (((local_4c != '\0') && (local_4a == '\0')) &&
           (UVar1 = loadParentsExceptRoot
                              (&stack0xffffffffffffffb8,usrDataPath + 0x58,0x9d,'\0',local_158,
                               pUStack_30), UVar1 == '\0')) goto LAB_0039a74a;
      }
    }
    if (t1 == (UResourceDataEntry *)0x0) {
      strcpy(usrDataPath + 0x58,"root");
      t1 = findFirstExisting(localeID_local,usrDataPath + 0x58,&local_4a,&local_4c,&local_49,
                             (UErrorCode *)((long)&r + 4));
      if (r._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
        *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_0039a74a;
      }
      if (t1 == (UResourceDataEntry *)0x0) {
        *pUStack_30 = U_MISSING_RESOURCE_ERROR;
        goto LAB_0039a74a;
      }
      r._4_4_ = U_USING_DEFAULT_WARNING;
      local_4b = '\x01';
      pUStack_48 = t1;
    }
    else if ((((local_4a == '\0') && (iVar2 = strcmp(pUStack_48->fName,"root"), iVar2 != 0)) &&
             (pUStack_48->fParent == (UResourceDataEntry *)0x0)) && ((t1->fData).noFallback == '\0')
            ) {
      UVar1 = insertRootBundle(&stack0xffffffffffffffb8,pUStack_30);
      if (UVar1 == '\0') goto LAB_0039a74a;
      if (local_4b == '\0') {
        t1->fBogus = U_USING_DEFAULT_WARNING;
      }
    }
    while( true ) {
      bVar3 = false;
      if ((t1 != (UResourceDataEntry *)0x0) && (bVar3 = false, local_4a == '\0')) {
        bVar3 = pUStack_48->fParent != (UResourceDataEntry *)0x0;
      }
      if (!bVar3) break;
      pUStack_48->fParent->fCountExisting = pUStack_48->fParent->fCountExisting + 1;
      pUStack_48 = pUStack_48->fParent;
    }
  }
LAB_0039a74a:
  umtx_unlock_63(&resbMutex);
  UVar1 = U_SUCCESS(*pUStack_30);
  if (UVar1 == '\0') {
    path_local = (char *)0x0;
  }
  else {
    if (r._4_4_ != U_ZERO_ERROR) {
      *pUStack_30 = r._4_4_;
    }
    path_local = (char *)t1;
  }
  return (UResourceDataEntry *)path_local;
}

Assistant:

static UResourceDataEntry *entryOpen(const char* path, const char* localeID,
                                     UResOpenType openType, UErrorCode* status) {
    U_ASSERT(openType != URES_OPEN_DIRECT);
    UErrorCode intStatus = U_ZERO_ERROR;
    UResourceDataEntry *r = NULL;
    UResourceDataEntry *t1 = NULL;
    UBool isDefault = FALSE;
    UBool isRoot = FALSE;
    UBool hasRealData = FALSE;
    UBool hasChopped = TRUE;
    UBool usingUSRData = U_USE_USRDATA && ( path == NULL || uprv_strncmp(path,U_ICUDATA_NAME,8) == 0);

    char name[ULOC_FULLNAME_CAPACITY];
    char usrDataPath[96];

    initCache(status);

    if(U_FAILURE(*status)) {
        return NULL;
    }

    uprv_strncpy(name, localeID, sizeof(name) - 1);
    name[sizeof(name) - 1] = 0;

    if ( usingUSRData ) {
        if ( path == NULL ) {
            uprv_strcpy(usrDataPath, U_USRDATA_NAME);
        } else {
            uprv_strncpy(usrDataPath, path, sizeof(usrDataPath) - 1);
            usrDataPath[0] = 'u';
            usrDataPath[1] = 's';
            usrDataPath[2] = 'r';
            usrDataPath[sizeof(usrDataPath) - 1] = 0;
        }
    }
 
    umtx_lock(&resbMutex);
    { /* umtx_lock */
        /* We're going to skip all the locales that do not have any data */
        r = findFirstExisting(path, name, &isRoot, &hasChopped, &isDefault, &intStatus);

        // If we failed due to out-of-memory, report the failure and exit early.
        if (intStatus == U_MEMORY_ALLOCATION_ERROR) {
            *status = intStatus;
            goto finishUnlock;
        }

        if(r != NULL) { /* if there is one real locale, we can look for parents. */
            t1 = r;
            hasRealData = TRUE;
            if ( usingUSRData ) {  /* This code inserts user override data into the inheritance chain */
                UErrorCode usrStatus = U_ZERO_ERROR;
                UResourceDataEntry *u1 = init_entry(t1->fName, usrDataPath, &usrStatus);
                // If we failed due to out-of-memory, report the failure and exit early.
                if (intStatus == U_MEMORY_ALLOCATION_ERROR) {
                    *status = intStatus;
                    goto finishUnlock;
                }
                if ( u1 != NULL ) {
                    if(u1->fBogus == U_ZERO_ERROR) {
                        u1->fParent = t1;
                        r = u1;
                    } else {
                        /* the USR override data wasn't found, set it to be deleted */
                        u1->fCountExisting = 0;
                    }
                }
            }
            if (hasChopped && !isRoot) {
                if (!loadParentsExceptRoot(t1, name, UPRV_LENGTHOF(name), usingUSRData, usrDataPath, status)) {
                    goto finishUnlock;
                }
            }
        }

        /* we could have reached this point without having any real data */
        /* if that is the case, we need to chain in the default locale   */
        if(r==NULL && openType == URES_OPEN_LOCALE_DEFAULT_ROOT && !isDefault && !isRoot) {
            /* insert default locale */
            uprv_strcpy(name, uloc_getDefault());
            r = findFirstExisting(path, name, &isRoot, &hasChopped, &isDefault, &intStatus);
            // If we failed due to out-of-memory, report the failure and exit early.
            if (intStatus == U_MEMORY_ALLOCATION_ERROR) {
                *status = intStatus;
                goto finishUnlock;
            }
            intStatus = U_USING_DEFAULT_WARNING;
            if(r != NULL) { /* the default locale exists */
                t1 = r;
                hasRealData = TRUE;
                isDefault = TRUE;
                // TODO: Why not if (usingUSRData) { ... } like in the non-default-locale code path?
                if (hasChopped && !isRoot) {
                    if (!loadParentsExceptRoot(t1, name, UPRV_LENGTHOF(name), usingUSRData, usrDataPath, status)) {
                        goto finishUnlock;
                    }
                }
            } 
        }

        /* we could still have r == NULL at this point - maybe even default locale is not */
        /* present */
        if(r == NULL) {
            uprv_strcpy(name, kRootLocaleName);
            r = findFirstExisting(path, name, &isRoot, &hasChopped, &isDefault, &intStatus);
            // If we failed due to out-of-memory, report the failure and exit early.
            if (intStatus == U_MEMORY_ALLOCATION_ERROR) {
                *status = intStatus;
                goto finishUnlock;
            }
            if(r != NULL) {
                t1 = r;
                intStatus = U_USING_DEFAULT_WARNING;
                hasRealData = TRUE;
            } else { /* we don't even have the root locale */
                *status = U_MISSING_RESOURCE_ERROR;
                goto finishUnlock;
            }
        } else if(!isRoot && uprv_strcmp(t1->fName, kRootLocaleName) != 0 &&
                t1->fParent == NULL && !r->fData.noFallback) {
            if (!insertRootBundle(t1, status)) {
                goto finishUnlock;
            }
            if(!hasRealData) {
                r->fBogus = U_USING_DEFAULT_WARNING;
            }
        }

        // TODO: Does this ever loop?
        while(r != NULL && !isRoot && t1->fParent != NULL) {
            t1->fParent->fCountExisting++;
            t1 = t1->fParent;
        }
    } /* umtx_lock */
finishUnlock:
    umtx_unlock(&resbMutex);

    if(U_SUCCESS(*status)) {
        if(intStatus != U_ZERO_ERROR) {
            *status = intStatus;  
        }
        return r;
    } else {
        return NULL;
    }
}